

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteConObjExpressions
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ExprArgWriter ew;
  DefVarWriterFactory local_40;
  
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons < 1) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar4 = uVar3 + 1;
      local_40.k_ = (int)uVar4;
      local_40.nlw_ = this;
      ExampleNLFeeder::
      FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
                (this->feeder_,local_40.k_,&local_40);
      BinaryFormatter::apr
                (&this->super_FormatterType,&this->nm,"%c%d\t#%s\n",0x43,uVar3 & 0xffffffff,
                 this->feeder_->mdl_->con_name[uVar3]);
      local_40.k_ = 1;
      local_40.nlw_ = this;
      ExampleModel::
      WriteConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
                (this->feeder_->mdl_,(int)uVar3,(ExprArgWriter *)&local_40);
      uVar3 = uVar4;
    } while ((long)uVar4 <
             (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  }
  if ((int)uVar4 <
      (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons +
      (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      iVar1 = (int)(uVar4 + 1);
      local_40.nlw_ = this;
      local_40.k_ = iVar1;
      ExampleNLFeeder::
      FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
                (this->feeder_,iVar1,&local_40);
      BinaryFormatter::apr
                (&this->super_FormatterType,&this->nm,"%c%d\t#%s\n",0x4c,
                 (ulong)(uint)((int)uVar4 -
                              (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                              num_algebraic_cons),this->feeder_->mdl_->con_name[uVar4]);
      local_40.k_ = 1;
      local_40.nlw_ = this;
      ExampleModel::
      WriteConExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
                (this->feeder_->mdl_,(int)uVar4,(ExprArgWriter *)&local_40);
      uVar4 = uVar4 + 1;
    } while (iVar1 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons +
                     (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  }
  if (0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs) {
    iVar1 = -1;
    uVar4 = 0;
    do {
      local_40.nlw_ = this;
      local_40.k_ = iVar1;
      ExampleNLFeeder::
      FeedDefinedVariables<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::DefVarWriterFactory>
                (this->feeder_,iVar1,&local_40);
      BinaryFormatter::apr
                (&this->super_FormatterType,&this->nm,"%c%d %d\t#%s\n",0x4f,uVar4,
                 (ulong)(uint)this->feeder_->mdl_->obj_sense,"Obj_t2t3");
      local_40.k_ = 1;
      local_40.nlw_ = this;
      ExampleModel::
      WriteObjExpr<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ExprArgWriter>
                (this->feeder_->mdl_,(ExprArgWriter *)&local_40);
      uVar2 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar2;
      iVar1 = iVar1 + -1;
    } while ((int)uVar2 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConObjExpressions() {
  int i=0;
  for (; i<Hdr().num_algebraic_cons; ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'C', i,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (;
       i<Hdr().num_algebraic_cons + Hdr().num_logical_cons;
       ++i) {
    WriteDefinedVariables(i+1);              // i+1
    apr(nm, "%c%d\t#%s\n", 'L',
        i - Hdr().num_algebraic_cons,
        Feeder().ConDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedConExpression(i, ew);
  }
  for (i=0; i<Hdr().num_objs; ++i) {
    WriteDefinedVariables(-i-1);              // -i-1
    apr(nm, "%c%d %d\t#%s\n", 'O', i,
        (int)Feeder().ObjType(i),
        Feeder().ObjDescription(i));
    ExprArgWriter ew(*this, 1);
    Feeder().FeedObjExpression(i, ew);
  }
}